

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

ssize_t __thiscall
ymfm::fm_engine_base<ymfm::opn_registers_base<false>_>::write
          (fm_engine_base<ymfm::opn_registers_base<false>_> *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  pointer this_00;
  ulong extraout_RAX;
  uint32_t local_1c;
  uint local_18;
  uint32_t keyon_opmask;
  uint32_t keyon_channel;
  uint8_t data_local;
  uint16_t regnum_local;
  fm_engine_base<ymfm::opn_registers_base<false>_> *this_local;
  
  keyon_opmask._1_1_ = (byte)__buf;
  keyon_opmask._2_2_ = (ushort)__fd;
  _keyon_channel = this;
  debug::log_fm_write<char_const(&)[13],unsigned_short&,unsigned_char&>
            ((char (*) [13])"%03X = %02X\n",(unsigned_short *)((long)&keyon_opmask + 2),
             (uchar *)((long)&keyon_opmask + 1));
  if (keyon_opmask._2_2_ == 0x27) {
    uVar1 = (*(code *)this->m_intf->m_engine->_vptr_ymfm_engine_callbacks)
                      (this->m_intf,keyon_opmask._1_1_);
  }
  else {
    this->m_modified_channels = 7;
    uVar1 = opn_registers_base<false>::write
                      (&this->m_regs,(uint)keyon_opmask._2_2_,(void *)(ulong)keyon_opmask._1_1_,
                       (size_t)&local_18);
    if (((uVar1 & 1) != 0) && (local_18 < 3)) {
      this_00 = std::
                unique_ptr<ymfm::fm_channel<ymfm::opn_registers_base<false>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<false>_>_>_>
                ::operator->(this->m_channel + local_18);
      fm_channel<ymfm::opn_registers_base<false>_>::keyonoff(this_00,local_1c,KEYON_NORMAL,local_18)
      ;
      uVar1 = extraout_RAX;
    }
  }
  return uVar1;
}

Assistant:

void fm_engine_base<RegisterType>::write(uint16_t regnum, uint8_t data)
{
	debug::log_fm_write("%03X = %02X\n", regnum, data);

	// special case: writes to the mode register can impact IRQs;
	// schedule these writes to ensure ordering with timers
	if (regnum == RegisterType::REG_MODE)
	{
		m_intf.ymfm_sync_mode_write(data);
		return;
	}

	// for now just mark all channels as modified
	m_modified_channels = ALL_CHANNELS;

	// most writes are passive, consumed only when needed
	uint32_t keyon_channel;
	uint32_t keyon_opmask;
	if (m_regs.write(regnum, data, keyon_channel, keyon_opmask))
	{
		// handle writes to the keyon register(s)
		if (keyon_channel < CHANNELS)
		{
			// normal channel on/off
			m_channel[keyon_channel]->keyonoff(keyon_opmask, KEYON_NORMAL, keyon_channel);
		}
		else if (CHANNELS >= 9 && keyon_channel == RegisterType::RHYTHM_CHANNEL)
		{
			// special case for the OPL rhythm channels
			m_channel[6]->keyonoff(bitfield(keyon_opmask, 4) ? 3 : 0, KEYON_RHYTHM, 6);
			m_channel[7]->keyonoff(bitfield(keyon_opmask, 0) | (bitfield(keyon_opmask, 3) << 1), KEYON_RHYTHM, 7);
			m_channel[8]->keyonoff(bitfield(keyon_opmask, 2) | (bitfield(keyon_opmask, 1) << 1), KEYON_RHYTHM, 8);
		}
	}
}